

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# INTEGER.c
# Opt level: O3

asn_dec_rval_t
INTEGER_decode_uper(asn_codec_ctx_t *opt_codec_ctx,asn_TYPE_descriptor_t *td,
                   asn_per_constraints_t *constraints,void **sptr,asn_per_data_t *pd)

{
  asn_per_constraint_flags aVar1;
  uint uVar2;
  void *pvVar3;
  int32_t iVar4;
  int iVar5;
  INTEGER_t *st;
  uint8_t *puVar6;
  ssize_t sVar7;
  ulong uVar8;
  asn_dec_rval_t aVar9;
  unsigned_long uvalue;
  int repeat;
  unsigned_long local_40;
  int local_34;
  
  pvVar3 = td->specifics;
  st = (INTEGER_t *)*sptr;
  if (st == (INTEGER_t *)0x0) {
    st = (INTEGER_t *)calloc(1,0x10);
    *sptr = st;
    if (st != (INTEGER_t *)0x0) goto LAB_00140092;
  }
  else {
LAB_00140092:
    if ((constraints == (asn_per_constraints_t *)0x0) &&
       (constraints = td->per_constraints, constraints == (asn_per_constraints_t *)0x0)) {
      constraints = (asn_per_constraints_t *)0x0;
    }
    else if (((constraints->value).flags & APC_EXTENSIBLE) != APC_UNCONSTRAINED) {
      uVar8 = 1;
      iVar4 = per_get_few_bits(pd,1);
      if (iVar4 != 0) {
        constraints = (asn_per_constraints_t *)0x0;
      }
      if (iVar4 < 0) goto LAB_00140260;
    }
    free(st->buf);
    st->buf = (uint8_t *)0x0;
    st->size = 0;
    if (constraints != (asn_per_constraints_t *)0x0) {
      aVar1 = (constraints->value).flags;
      if ((aVar1 & APC_SEMI_CONSTRAINED) == APC_UNCONSTRAINED) {
        if ((aVar1 & APC_CONSTRAINED) == APC_UNCONSTRAINED) {
          if (aVar1 == APC_UNCONSTRAINED) goto LAB_001401ff;
        }
        else {
          uVar2 = (constraints->value).range_bits;
          if (-1 < (int)uVar2) {
            uVar8 = (ulong)uVar2 + 7 >> 3;
            puVar6 = (uint8_t *)malloc(uVar8 + 2);
            st->buf = puVar6;
            goto LAB_00140141;
          }
        }
      }
      else {
        puVar6 = (uint8_t *)calloc(1,2);
        st->buf = puVar6;
        uVar8 = 1;
LAB_00140141:
        if (puVar6 == (uint8_t *)0x0) goto LAB_0014025b;
        st->size = (int)uVar8;
      }
      uVar2 = (constraints->value).range_bits;
      if (-1 < (int)uVar2) {
        uVar8 = 2;
        if (uVar2 < 0x41) {
          if ((pvVar3 == (void *)0x0) || (*(int *)((long)pvVar3 + 0x20) == 0)) {
            iVar5 = uper_get_constrained_whole_number(pd,&local_40,uVar2);
            uVar8 = 1;
            if (iVar5 != 0) goto LAB_00140260;
            local_40 = local_40 + (constraints->value).lower_bound;
            iVar5 = asn_long2INTEGER(st,local_40);
          }
          else {
            iVar5 = uper_get_constrained_whole_number(pd,&local_40,uVar2);
            uVar8 = 1;
            if (iVar5 != 0) goto LAB_00140260;
            local_40 = local_40 + (constraints->value).lower_bound;
            iVar5 = asn_ulong2INTEGER(st,local_40);
          }
          uVar8 = 2;
          if (iVar5 == 0) {
            uVar8 = 0;
          }
        }
        goto LAB_00140260;
      }
    }
LAB_001401ff:
    do {
      sVar7 = uper_get_length(pd,-1,&local_34);
      uVar8 = 1;
      if (sVar7 < 0) goto LAB_00140260;
      puVar6 = (uint8_t *)realloc(st->buf,sVar7 + st->size + 1);
      if (puVar6 == (uint8_t *)0x0) goto LAB_0014025b;
      st->buf = puVar6;
      iVar5 = per_get_many_bits(pd,puVar6 + st->size,0,(int)sVar7 * 8);
      if (iVar5 < 0) goto LAB_00140260;
      iVar5 = (int)sVar7 + st->size;
      st->size = iVar5;
    } while (local_34 != 0);
    uVar8 = 0;
    st->buf[iVar5] = '\0';
    if (((constraints == (asn_per_constraints_t *)0x0) || ((constraints->value).lower_bound == 0))
       || ((iVar5 = asn_INTEGER2long(st,(long *)&local_40), iVar5 == 0 &&
           (iVar5 = asn_long2INTEGER(st,(constraints->value).lower_bound + local_40), iVar5 == 0))))
    goto LAB_00140260;
  }
LAB_0014025b:
  uVar8 = 2;
LAB_00140260:
  aVar9.consumed = 0;
  aVar9._0_8_ = uVar8;
  return aVar9;
}

Assistant:

asn_dec_rval_t
INTEGER_decode_uper(asn_codec_ctx_t *opt_codec_ctx, asn_TYPE_descriptor_t *td,
	asn_per_constraints_t *constraints, void **sptr, asn_per_data_t *pd) {
	asn_INTEGER_specifics_t *specs=(asn_INTEGER_specifics_t *)td->specifics;
	asn_dec_rval_t rval = { RC_OK, 0 };
	INTEGER_t *st = (INTEGER_t *)*sptr;
	asn_per_constraint_t *ct;
	int repeat;

	(void)opt_codec_ctx;

	if(!st) {
		st = (INTEGER_t *)(*sptr = CALLOC(1, sizeof(*st)));
		if(!st) ASN__DECODE_FAILED;
	}

	if(!constraints) constraints = td->per_constraints;
	ct = constraints ? &constraints->value : 0;

	if(ct && ct->flags & APC_EXTENSIBLE) {
		int inext = per_get_few_bits(pd, 1);
		if(inext < 0) ASN__DECODE_STARVED;
		if(inext) ct = 0;
	}

	FREEMEM(st->buf);
	st->buf = 0;
	st->size = 0;
	if(ct) {
		if(ct->flags & APC_SEMI_CONSTRAINED) {
			st->buf = (uint8_t *)CALLOC(1, 2);
			if(!st->buf) ASN__DECODE_FAILED;
			st->size = 1;
		} else if(ct->flags & APC_CONSTRAINED && ct->range_bits >= 0) {
			size_t size = (ct->range_bits + 7) >> 3;
			st->buf = (uint8_t *)MALLOC(1 + size + 1);
			if(!st->buf) ASN__DECODE_FAILED;
			st->size = size;
		}
	}

	/* X.691-2008/11, #13.2.2, constrained whole number */
	if(ct && ct->flags != APC_UNCONSTRAINED) {
		/* #11.5.6 */
		ASN_DEBUG("Integer with range %d bits", ct->range_bits);
		if(ct->range_bits >= 0) {
			if((size_t)ct->range_bits > 8 * sizeof(unsigned long))
				ASN__DECODE_FAILED;

			if(specs && specs->field_unsigned) {
				unsigned long uvalue;
				if(uper_get_constrained_whole_number(pd,
					&uvalue, ct->range_bits))
					ASN__DECODE_STARVED;
				ASN_DEBUG("Got value %lu + low %ld",
					uvalue, ct->lower_bound);
				uvalue += ct->lower_bound;
				if(asn_ulong2INTEGER(st, uvalue))
					ASN__DECODE_FAILED;
			} else {
				unsigned long svalue;
				if(uper_get_constrained_whole_number(pd,
					&svalue, ct->range_bits))
					ASN__DECODE_STARVED;
				ASN_DEBUG("Got value %ld + low %ld",
					svalue, ct->lower_bound);
				svalue += ct->lower_bound;
				if(asn_long2INTEGER(st, svalue))
					ASN__DECODE_FAILED;
			}
			return rval;
		}
	} else {
		ASN_DEBUG("Decoding unconstrained integer %s", td->name);
	}

	/* X.691, #12.2.3, #12.2.4 */
	do {
		ssize_t len;
		void *p;
		int ret;

		/* Get the PER length */
		len = uper_get_length(pd, -1, &repeat);
		if(len < 0) ASN__DECODE_STARVED;

		p = REALLOC(st->buf, st->size + len + 1);
		if(!p) ASN__DECODE_FAILED;
		st->buf = (uint8_t *)p;

		ret = per_get_many_bits(pd, &st->buf[st->size], 0, 8 * len);
		if(ret < 0) ASN__DECODE_STARVED;
		st->size += len;
	} while(repeat);
	st->buf[st->size] = 0;	/* JIC */

	/* #12.2.3 */
	if(ct && ct->lower_bound) {
		/*
		 * TODO: replace by in-place arithmetics.
		 */
		long value;
		if(asn_INTEGER2long(st, &value))
			ASN__DECODE_FAILED;
		if(asn_long2INTEGER(st, value + ct->lower_bound))
			ASN__DECODE_FAILED;
	}

	return rval;
}